

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

uint32_t elf_lzma_len(uchar *compressed,size_t compressed_size,uint16_t *probs,int is_rep,
                     uint pos_state,size_t *poffset,uint32_t *prange,uint32_t *pcode)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0xa68;
  if (is_rep == 0) {
    lVar5 = 0x664;
  }
  iVar2 = elf_lzma_bit(compressed,compressed_size,(uint16_t *)(lVar5 + (long)probs),poffset,prange,
                       pcode);
  if (iVar2 == 0) {
    uVar1 = pos_state * 8 + 0x536;
    if (is_rep == 0) {
      uVar1 = pos_state * 8 + 0x334;
    }
    uVar4 = (ulong)uVar1;
    iVar2 = 2;
    uVar3 = 3;
  }
  else {
    lVar5 = 0xa6a;
    if (is_rep == 0) {
      lVar5 = 0x666;
    }
    iVar2 = elf_lzma_bit(compressed,compressed_size,(uint16_t *)(lVar5 + (long)probs),poffset,prange
                         ,pcode);
    if (iVar2 == 0) {
      uVar1 = pos_state * 8 + 0x5b6;
      if (is_rep == 0) {
        uVar1 = pos_state * 8 + 0x3b4;
      }
      uVar4 = (ulong)uVar1;
      iVar2 = 10;
      uVar3 = 3;
    }
    else {
      uVar4 = 0x636;
      if (is_rep == 0) {
        uVar4 = 0x434;
      }
      iVar2 = 0x12;
      uVar3 = 8;
    }
  }
  uVar3 = elf_lzma_integer(compressed,compressed_size,probs + uVar4,uVar3,poffset,prange,pcode);
  return uVar3 + iVar2;
}

Assistant:

static uint32_t
elf_lzma_len (const unsigned char *compressed, size_t compressed_size,
	      uint16_t *probs, int is_rep, unsigned int pos_state,
	      size_t *poffset, uint32_t *prange, uint32_t *pcode)
{
  uint16_t *probs_choice;
  uint16_t *probs_sym;
  uint32_t bits;
  uint32_t len;

  probs_choice = probs + (is_rep
			  ? LZMA_REP_LEN_CHOICE
			  : LZMA_MATCH_LEN_CHOICE);
  if (elf_lzma_bit (compressed, compressed_size, probs_choice, poffset,
		    prange, pcode))
    {
      probs_choice = probs + (is_rep
			      ? LZMA_REP_LEN_CHOICE2
			      : LZMA_MATCH_LEN_CHOICE2);
      if (elf_lzma_bit (compressed, compressed_size, probs_choice,
			poffset, prange, pcode))
	{
	  probs_sym = probs + (is_rep
			       ? LZMA_REP_LEN_HIGH (0)
			       : LZMA_MATCH_LEN_HIGH (0));
	  bits = 8;
	  len = 2 + 8 + 8;
	}
      else
	{
	  probs_sym = probs + (is_rep
			       ? LZMA_REP_LEN_MID (pos_state, 0)
			       : LZMA_MATCH_LEN_MID (pos_state, 0));
	  bits = 3;
	  len = 2 + 8;
	}
    }
  else
    {
      probs_sym = probs + (is_rep
			   ? LZMA_REP_LEN_LOW (pos_state, 0)
			   : LZMA_MATCH_LEN_LOW (pos_state, 0));
      bits = 3;
      len = 2;
    }

  len += elf_lzma_integer (compressed, compressed_size, probs_sym, bits,
			   poffset, prange, pcode);
  return len;
}